

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

void __thiscall
duckdb::LeastGreatestSortKeyState::LeastGreatestSortKeyState
          (LeastGreatestSortKeyState *this,idx_t column_count,OrderByNullType null_ordering)

{
  Allocator *allocator;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  (this->super_FunctionLocalState)._vptr_FunctionLocalState =
       (_func_int **)&PTR__LeastGreatestSortKeyState_024b5850;
  DataChunk::DataChunk(&this->sort_keys);
  LogicalType::LogicalType(&local_60,BLOB);
  Vector::Vector(&this->intermediate,&local_60,0x800);
  LogicalType::~LogicalType(&local_60);
  (this->modifiers).order_type = ASCENDING;
  (this->modifiers).null_type = null_ordering;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (column_count != 0) {
    do {
      LogicalType::LogicalType(&local_48,BLOB);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
      emplace_back<duckdb::LogicalType>(&local_78,&local_48);
      LogicalType::~LogicalType(&local_48);
      column_count = column_count - 1;
    } while (column_count != 0);
  }
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize
            (&this->sort_keys,allocator,(vector<duckdb::LogicalType,_true> *)&local_78,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  return;
}

Assistant:

explicit LeastGreatestSortKeyState(idx_t column_count, OrderByNullType null_ordering)
	    : intermediate(LogicalType::BLOB), modifiers(OrderType::ASCENDING, null_ordering) {
		vector<LogicalType> types;
		// initialize sort key chunk
		for (idx_t i = 0; i < column_count; i++) {
			types.push_back(LogicalType::BLOB);
		}
		sort_keys.Initialize(Allocator::DefaultAllocator(), types);
	}